

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sf-pcap-ng.c
# Opt level: O0

option_header * get_opthdr_from_block_data(pcap_t *p,block_cursor *cursor,char *errbuf)

{
  option_header *opthdr;
  char *errbuf_local;
  block_cursor *cursor_local;
  pcap_t *p_local;
  
  p_local = (pcap_t *)get_from_block_data(cursor,4,errbuf);
  if (p_local == (pcap_t *)0x0) {
    p_local = (pcap_t *)0x0;
  }
  else if (p->swapped != 0) {
    *(ushort *)&p_local->read_op =
         *(short *)&p_local->read_op << 8 | *(ushort *)&p_local->read_op >> 8;
    *(ushort *)((long)&p_local->read_op + 2) =
         *(short *)((long)&p_local->read_op + 2) << 8 |
         *(ushort *)((long)&p_local->read_op + 2) >> 8;
  }
  return (option_header *)p_local;
}

Assistant:

static struct option_header *
get_opthdr_from_block_data(pcap_t *p, struct block_cursor *cursor, char *errbuf)
{
	struct option_header *opthdr;

	opthdr = get_from_block_data(cursor, sizeof(*opthdr), errbuf);
	if (opthdr == NULL) {
		/*
		 * Option header is cut short.
		 */
		return (NULL);
	}

	/*
	 * Byte-swap it if necessary.
	 */
	if (p->swapped) {
		opthdr->option_code = SWAPSHORT(opthdr->option_code);
		opthdr->option_length = SWAPSHORT(opthdr->option_length);
	}

	return (opthdr);
}